

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O2

int jpc_dec_process_sot(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_dec_tile_t *pjVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  jpc_ppxstab_t *pjVar8;
  jpc_pocpchg_t *pjVar9;
  uint_fast16_t uVar10;
  jpc_dec_cp_t *pjVar11;
  jpc_dec_ccp_t *pjVar12;
  uint uVar13;
  uint uVar14;
  jas_image_cmptparm_t *cmptparms;
  jas_image_t *pjVar15;
  jpc_streamlist_t *streamlist;
  jas_stream_t **ppjVar16;
  jpc_ppxstabent_t **ppjVar17;
  jas_stream_t *stream;
  jpc_dec_cp_t *ptr;
  jpc_pchglist_t *pjVar18;
  jpc_dec_ccp_t *pjVar19;
  int iVar20;
  _Bool *p_Var21;
  ulong uVar22;
  long lVar23;
  jas_image_cmptparm_t *pjVar24;
  ulong uVar25;
  uint *buf;
  uint_fast32_t uVar26;
  bool bVar27;
  
  if (dec->state == 4) {
    cmptparms = (jas_image_cmptparm_t *)jas_alloc2((long)dec->numcomps,0x38);
    if (cmptparms == (jas_image_cmptparm_t *)0x0) {
      return -1;
    }
    uVar14 = dec->numcomps;
    uVar13 = 0;
    if (0 < (int)uVar14) {
      uVar13 = uVar14;
    }
    p_Var21 = &dec->cmpts->sgnd;
    pjVar24 = cmptparms;
    while (bVar27 = uVar13 != 0, uVar13 = uVar13 - 1, bVar27) {
      pjVar24->tlx = 0;
      pjVar24->tly = 0;
      pjVar24->prec = (int)*(uint_fast16_t *)(p_Var21 + -8);
      pjVar24->sgnd = (uint)*p_Var21;
      uVar26 = *(uint_fast32_t *)(p_Var21 + -0x10);
      pjVar24->width = *(uint_fast32_t *)(p_Var21 + -0x18);
      pjVar24->height = uVar26;
      uVar26 = *(uint_fast32_t *)(p_Var21 + -0x20);
      pjVar24->hstep = ((jpc_dec_cmpt_t *)(p_Var21 + -0x28))->hstep;
      pjVar24->vstep = uVar26;
      pjVar24 = pjVar24 + 1;
      p_Var21 = p_Var21 + 0x40;
    }
    pjVar15 = jas_image_create(uVar14,cmptparms,0x4000);
    dec->image = pjVar15;
    jas_free(cmptparms);
    if (pjVar15 == (jas_image_t *)0x0) {
      return -1;
    }
    pjVar8 = dec->ppmstab;
    if (pjVar8 != (jpc_ppxstab_t *)0x0) {
      streamlist = (jpc_streamlist_t *)jas_malloc(0x10);
      if (streamlist == (jpc_streamlist_t *)0x0) {
LAB_0011bacc:
        dec->pkthdrstreams = (jpc_streamlist_t *)0x0;
        return -1;
      }
      streamlist->numstreams = 0;
      streamlist->maxstreams = 100;
      ppjVar16 = (jas_stream_t **)jas_alloc2(100,8);
      streamlist->streams = ppjVar16;
      if (ppjVar16 == (jas_stream_t **)0x0) {
        jas_free(streamlist);
        goto LAB_0011bacc;
      }
      uVar22 = 0;
      uVar25 = (ulong)(uint)streamlist->maxstreams;
      if (streamlist->maxstreams < 1) {
        uVar25 = uVar22;
      }
      for (; uVar25 != uVar22; uVar22 = uVar22 + 1) {
        streamlist->streams[uVar22] = (jas_stream_t *)0x0;
      }
      if (pjVar8->numents != 0) {
        ppjVar17 = pjVar8->ents;
        iVar20 = 0;
        do {
          uVar26 = (*ppjVar17)->len;
          buf = (uint *)(*ppjVar17)->data;
          do {
            if ((uVar26 < 4) ||
               (stream = jas_stream_memopen((char *)0x0,0), stream == (jas_stream_t *)0x0)) {
LAB_0011bab7:
              jpc_streamlist_destroy(streamlist);
              goto LAB_0011bacc;
            }
            iVar4 = streamlist->numstreams;
            iVar5 = streamlist->maxstreams;
            ppjVar16 = streamlist->streams;
            if (iVar5 <= iVar4) {
              ppjVar16 = (jas_stream_t **)jas_realloc2(ppjVar16,(long)iVar5 + 0x800,8);
              if (ppjVar16 != (jas_stream_t **)0x0) {
                iVar6 = streamlist->numstreams;
                iVar7 = streamlist->maxstreams;
                for (lVar23 = (long)iVar6; lVar23 < iVar7; lVar23 = lVar23 + 1) {
                  streamlist->streams[lVar23] = (jas_stream_t *)0x0;
                }
                streamlist->maxstreams = iVar5 + 0x400;
                streamlist->streams = ppjVar16;
                if (iVar6 == iVar4) goto LAB_0011b9f0;
              }
              goto LAB_0011bab7;
            }
LAB_0011b9f0:
            ppjVar16[iVar4] = stream;
            streamlist->numstreams = iVar4 + 1;
            uVar14 = *buf;
            uVar26 = uVar26 - 4;
            buf = buf + 1;
            for (uVar25 = (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8
                                 | uVar14 << 0x18); uVar25 != 0; uVar25 = uVar25 - lVar23) {
              if (uVar26 == 0) {
                iVar20 = iVar20 + 1;
                if (pjVar8->numents <= iVar20) goto LAB_0011bab7;
                uVar26 = pjVar8->ents[iVar20]->len;
                buf = (uint *)pjVar8->ents[iVar20]->data;
              }
              uVar22 = uVar26;
              if (uVar25 < uVar26) {
                uVar22 = uVar25;
              }
              uVar13 = (uint)uVar22;
              uVar14 = jas_stream_write(stream,buf,uVar13);
              if (uVar14 != uVar13) goto LAB_0011bab7;
              lVar23 = (long)(int)uVar13;
              buf = (uint *)((long)buf + lVar23);
              uVar26 = uVar26 - lVar23;
            }
            jas_stream_rewind(stream);
          } while (uVar26 != 0);
          iVar20 = iVar20 + 1;
          if (pjVar8->numents <= iVar20) break;
          ppjVar17 = pjVar8->ents + iVar20;
        } while( true );
      }
      dec->pkthdrstreams = streamlist;
      jpc_ppxstab_destroy(dec->ppmstab);
      dec->ppmstab = (jpc_ppxstab_t *)0x0;
    }
  }
  iVar20 = -1;
  pjVar9 = (ms->parms).poc.pchgs;
  if (pjVar9 == (jpc_pocpchg_t *)0x0) {
    lVar23 = 0;
  }
  else {
    lVar23 = (long)pjVar9 + (dec->in->rwcnt_ - ms->len) + -4;
  }
  dec->curtileendoff = lVar23;
  uVar10 = (ms->parms).sot.tileno;
  if (dec->numtiles <= (int)uVar10) {
    jas_eprintf("invalid tile number in SOT marker segment\n");
    return -1;
  }
  pjVar1 = dec->tiles + uVar10;
  dec->curtile = pjVar1;
  bVar2 = (ms->parms).sot.partno;
  if (dec->tiles[uVar10].partno != (uint)bVar2) {
    return -1;
  }
  iVar4 = pjVar1->numparts;
  if (0 < iVar4 && iVar4 <= (int)(uint)bVar2) {
    return -1;
  }
  if ((iVar4 == 0) && (bVar3 = (ms->parms).sot.numparts, bVar3 != 0)) {
    pjVar1->numparts = (uint)bVar3;
  }
  pjVar1->pptstab = (jpc_ppxstab_t *)0x0;
  if (pjVar1->state == 0) {
    pjVar1->state = 1;
    if (pjVar1->cp != (jpc_dec_cp_t *)0x0) {
      __assert_fail("!tile->cp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                    ,0x22c,"int jpc_dec_process_sot(jpc_dec_t *, jpc_ms_t *)");
    }
    pjVar11 = dec->cp;
    ptr = jpc_dec_cp_create((long)pjVar11->numcomps);
    if (ptr != (jpc_dec_cp_t *)0x0) {
      ptr->flags = pjVar11->flags;
      ptr->prgord = pjVar11->prgord;
      ptr->numlyrs = pjVar11->numlyrs;
      ptr->mctid = pjVar11->mctid;
      ptr->csty = pjVar11->csty;
      jpc_pchglist_destroy(ptr->pchglist);
      ptr->pchglist = (jpc_pchglist_t *)0x0;
      pjVar18 = jpc_pchglist_copy(pjVar11->pchglist);
      ptr->pchglist = pjVar18;
      if (pjVar18 != (jpc_pchglist_t *)0x0) {
        pjVar19 = ptr->ccps;
        pjVar12 = pjVar11->ccps;
        lVar23 = 0;
        for (iVar20 = 0; iVar20 < pjVar11->numcomps; iVar20 = iVar20 + 1) {
          memcpy((void *)((long)pjVar19->stepsizes + lVar23 + -0x18),
                 (void *)((long)pjVar12->stepsizes + lVar23 + -0x18),0x380);
          lVar23 = lVar23 + 0x380;
        }
        pjVar1->cp = ptr;
        pjVar11 = dec->cp;
        pjVar11->flags = pjVar11->flags & 3;
        pjVar19 = pjVar11->ccps;
        iVar20 = 0;
        if (0 < pjVar11->numcomps) {
          iVar20 = pjVar11->numcomps;
        }
        while (bVar27 = iVar20 != 0, iVar20 = iVar20 + -1, bVar27) {
          pjVar19->flags = 0;
          pjVar19 = pjVar19 + 1;
        }
        goto LAB_0011bb7e;
      }
      jas_free(ptr);
    }
    pjVar1->cp = (jpc_dec_cp_t *)0x0;
  }
  else {
    if (bVar2 - 1 == (uint)(ms->parms).sot.numparts) {
      pjVar1->state = 2;
    }
LAB_0011bb7e:
    dec->state = 0x10;
    iVar20 = 0;
  }
  return iVar20;
}

Assistant:

static int jpc_dec_process_sot(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_dec_tile_t *tile;
	jpc_sot_t *sot = &ms->parms.sot;
	jas_image_cmptparm_t *compinfos;
	jas_image_cmptparm_t *compinfo;
	jpc_dec_cmpt_t *cmpt;
	int cmptno;

	if (dec->state == JPC_MH) {

		if (!(compinfos = jas_alloc2(dec->numcomps,
		  sizeof(jas_image_cmptparm_t)))) {
			return -1;
		}
		for (cmptno = 0, cmpt = dec->cmpts, compinfo = compinfos;
		  cmptno < dec->numcomps; ++cmptno, ++cmpt, ++compinfo) {
			compinfo->tlx = 0;
			compinfo->tly = 0;
			compinfo->prec = cmpt->prec;
			compinfo->sgnd = cmpt->sgnd;
			compinfo->width = cmpt->width;
			compinfo->height = cmpt->height;
			compinfo->hstep = cmpt->hstep;
			compinfo->vstep = cmpt->vstep;
		}

		if (!(dec->image = jas_image_create(dec->numcomps, compinfos,
		  JAS_CLRSPC_UNKNOWN))) {
			jas_free(compinfos);
			return -1;
		}
		jas_free(compinfos);

		/* Is the packet header information stored in PPM marker segments in
		  the main header? */
		if (dec->ppmstab) {
			/* Convert the PPM marker segment data into a collection of streams
			  (one stream per tile-part). */
			if (!(dec->pkthdrstreams = jpc_ppmstabtostreams(dec->ppmstab))) {
				return -1;
			}
			jpc_ppxstab_destroy(dec->ppmstab);
			dec->ppmstab = 0;
		}
	}

	if (sot->len > 0) {
		dec->curtileendoff = jas_stream_getrwcount(dec->in) - ms->len -
		  4 + sot->len;
	} else {
		dec->curtileendoff = 0;
	}

	if (JAS_CAST(int, sot->tileno) >= dec->numtiles) {
		jas_eprintf("invalid tile number in SOT marker segment\n");
		return -1;
	}
	/* Set the current tile. */
	dec->curtile = &dec->tiles[sot->tileno];
	tile = dec->curtile;
	/* Ensure that this is the expected part number. */
	if (sot->partno != tile->partno) {
		return -1;
	}
	if (tile->numparts > 0 && sot->partno >= tile->numparts) {
		return -1;
	}
	if (!tile->numparts && sot->numparts > 0) {
		tile->numparts = sot->numparts;
	}

	tile->pptstab = 0;

	switch (tile->state) {
	case JPC_TILE_INIT:
		/* This is the first tile-part for this tile. */
		tile->state = JPC_TILE_ACTIVE;
		assert(!tile->cp);
		if (!(tile->cp = jpc_dec_cp_copy(dec->cp))) {
			return -1;
		}
		jpc_dec_cp_resetflags(dec->cp);
		break;
	default:
		if (sot->numparts == sot->partno - 1) {
			tile->state = JPC_TILE_ACTIVELAST;
		}
		break;
	}

	/* Note: We do not increment the expected tile-part number until
	  all processing for this tile-part is complete. */

	/* We should expect to encounter other tile-part header marker
	  segments next. */
	dec->state = JPC_TPH;

	return 0;
}